

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite_demovfs.c
# Opt level: O2

int demoDirectWrite(DemoFile *p,void *zBuf,int iAmt,unqlite_int64 iOfst)

{
  int iVar1;
  __off_t _Var2;
  size_t sVar3;
  
  _Var2 = lseek(p->fd,iOfst,0);
  if (_Var2 == iOfst) {
    sVar3 = write(p->fd,zBuf,(long)iAmt);
    iVar1 = (uint)(sVar3 == (long)iAmt) * 2 + -2;
  }
  else {
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

static int demoDirectWrite(
  DemoFile *p,                    /* File handle */
  const void *zBuf,               /* Buffer containing data to write */
  int iAmt,                       /* Size of data to write in bytes */
  unqlite_int64 iOfst             /* File offset to write to */
  ){
#if defined(_MSC_VER) || defined(__MINGW32__)
  __int64
#else
  off_t
#endif /* defined(_MSC_VER) || defined(__MINGW32__) */
    ofst;                         /* Return value from lseek() */
  size_t nWrite;                  /* Return value from write() */

  ofst = lseek(p->fd, iOfst, SEEK_SET);
  if( ofst!=iOfst ){
    return UNQLITE_IOERR;
  }

  nWrite = write(p->fd, zBuf, iAmt);
  if( nWrite!=iAmt ){
    return UNQLITE_IOERR;
  }

  return UNQLITE_OK;
}